

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O1

int satoko_simplify(solver_t *s)

{
  long *plVar1;
  uint cref;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  vec_uint_t *pvVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (s->trail_lim->size != 0) {
    __assert_fail("solver_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0xcf,"int satoko_simplify(solver_t *)");
  }
  uVar4 = solver_propagate(s);
  iVar8 = 0;
  if (((uVar4 == 0xffffffff) && (iVar8 = 1, s->n_assigns_simplify != s->trail->size)) &&
     (s->n_props_simplify < 1)) {
    pvVar6 = s->originals;
    uVar5 = (ulong)pvVar6->size;
    if (pvVar6->size == 0) {
      uVar4 = 0;
    }
    else {
      uVar11 = 0;
      uVar4 = 0;
      do {
        cref = pvVar6->data[uVar11];
        puVar2 = s->all_clauses->data;
        uVar7 = (ulong)puVar2[(ulong)cref + 1];
        if (uVar7 != 0) {
          puVar2 = puVar2 + cref;
          uVar9 = 0;
          do {
            uVar10 = puVar2[uVar9 + 2] >> 1;
            if (s->assigns->size <= uVar10) {
              __assert_fail("idx >= 0 && idx < p->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_char.h"
                            ,0x85,"char vec_char_at(vec_char_t *, unsigned int)");
            }
            if (s->assigns->data[uVar10] == ((byte)puVar2[uVar9 + 2] & 1)) {
              *(byte *)puVar2 = (byte)*puVar2 | 2;
              plVar1 = &(s->stats).n_original_lits;
              *plVar1 = *plVar1 - uVar7;
              clause_unwatch(s,cref);
              goto LAB_005547af;
            }
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
        if ((uint)uVar5 <= uVar4) {
          __assert_fail("(idx >= 0) && (idx < vec_uint_size(p))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                        ,0xc2,"void vec_uint_assign(vec_uint_t *, unsigned int, unsigned int)");
        }
        uVar5 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        pvVar6->data[uVar5] = cref;
LAB_005547af:
        uVar11 = uVar11 + 1;
        pvVar6 = s->originals;
        uVar5 = (ulong)pvVar6->size;
      } while (uVar11 < uVar5);
    }
    if (pvVar6->cap < uVar4) {
      __assert_fail("p->cap >= new_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                    ,0x65,"void vec_uint_shrink(vec_uint_t *, unsigned int)");
    }
    pvVar6->size = uVar4;
    solver_rebuild_order(s);
    lVar3 = (s->stats).n_learnt_lits;
    s->n_assigns_simplify = s->trail->size;
    s->n_props_simplify = lVar3 + (s->stats).n_original_lits;
  }
  return iVar8;
}

Assistant:

int satoko_simplify(solver_t * s)
{
    unsigned i, j = 0;
    unsigned cref;

    assert(solver_dlevel(s) == 0);
    if (solver_propagate(s) != UNDEF)
        return SATOKO_ERR;
    if (s->n_assigns_simplify == vec_uint_size(s->trail) || s->n_props_simplify > 0)
        return SATOKO_OK;

    vec_uint_foreach(s->originals, cref, i) {
        struct clause *clause = clause_fetch(s, cref);

    if (clause_is_satisfied(s, clause)) {
            clause->f_mark = 1;
            s->stats.n_original_lits -= clause->size;
            clause_unwatch(s, cref);
        } else
            vec_uint_assign(s->originals, j++, cref);
    }
    vec_uint_shrink(s->originals, j);
    solver_rebuild_order(s);
    s->n_assigns_simplify = vec_uint_size(s->trail);
    s->n_props_simplify = s->stats.n_original_lits + s->stats.n_learnt_lits;
    return SATOKO_OK;
}